

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permutation.cpp
# Opt level: O1

void __thiscall Permutation::Permutation(Permutation *this,int n)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  allocator_type local_9;
  
  std::vector<int,_std::allocator<int>_>::vector(&this->permutation_,(long)n,&local_9);
  piVar2 = (this->permutation_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (this->permutation_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar2 != piVar1) {
    iVar3 = 0;
    do {
      *piVar2 = iVar3;
      iVar3 = iVar3 + 1;
      piVar2 = piVar2 + 1;
    } while (piVar2 != piVar1);
  }
  return;
}

Assistant:

Permutation::Permutation(int n)
  : permutation_(n) {
  std::iota(permutation_.begin(), permutation_.end(), 0);
}